

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector
          (quad_value_bit_vector *this,int N_,string *str_raw)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  uchar uVar5;
  int iVar6;
  uint uVar7;
  string str;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar6 = 0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->N = N_;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  if (0 < (int)str_raw->_M_string_length) {
    lVar4 = 0;
    iVar6 = 0;
    do {
      cVar1 = (str_raw->_M_dataplus)._M_p[lVar4];
      if ((int)cVar1 - 0x30U < 10) {
        std::__cxx11::string::push_back((char)&local_50);
        iVar6 = iVar6 + 1;
      }
      else if (cVar1 != '_') {
        if ((cVar1 != 'z') && (cVar1 != 'x')) {
          __assert_fail("str_raw[i] == \'_\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x17d,
                        "bsim::quad_value_bit_vector::quad_value_bit_vector(const int, const std::string &)"
                       );
        }
        std::__cxx11::string::push_back((char)&local_50);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)str_raw->_M_string_length);
  }
  uVar2 = local_48;
  if (iVar6 <= this->N) {
    std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
              (&this->bits,(long)this->N);
    uVar7 = (uint)uVar2;
    if (0 < (int)uVar7) {
      lVar4 = (ulong)(uVar7 & 0x7fffffff) + 1;
      lVar3 = 0;
      do {
        cVar1 = local_50[lVar4 + -2];
        uVar5 = cVar1 != '0';
        if (cVar1 == 'x') {
          uVar5 = '\x02';
        }
        if (cVar1 == 'z') {
          uVar5 = '\x03';
        }
        (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
        .super__Vector_impl_data._M_start[lVar3].value = uVar5;
        lVar4 = lVar4 + -1;
        lVar3 = lVar3 + 1;
      } while (1 < lVar4);
    }
    lVar4 = (long)this->N;
    if ((int)uVar7 < this->N) {
      do {
        (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
        .super__Vector_impl_data._M_start[lVar4 + -1].value = '\0';
        lVar4 = lVar4 + -1;
      } while ((int)uVar7 < lVar4);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return;
  }
  __assert_fail("num_digits <= N",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                ,0x180,
                "bsim::quad_value_bit_vector::quad_value_bit_vector(const int, const std::string &)"
               );
}

Assistant:

quad_value_bit_vector(const int N_, const std::string& str_raw) : N(N_) {
      int num_digits = 0;
      std::string str;
      for (int i = 0; i < ((int) str_raw.size()); i++) {
	if (isdigit(str_raw[i])) {
	  num_digits++;
	  str += str_raw[i];
	} else if (str_raw[i] == 'z') {
          str += str_raw[i];
        } else if (str_raw[i] == 'x') {
          str += str_raw[i];
        } else {
	  assert(str_raw[i] == '_');
	}
      }
      assert(num_digits <= N);

      int len = str.size();      

      bits.resize(N);
      for (int i = len - 1; i >= 0; i--) {
        unsigned char val = (str[i] == '0') ? 0 : 1;
        if (str[i] == 'x') {
          val = QBV_UNKNOWN_VALUE;
        }
        if (str[i] == 'z') {
          val = QBV_HIGH_IMPEDANCE_VALUE;
        }

        int ind = len - i - 1;
        set(ind, val);
      }
      for (int i = N - 1; i >= len; i--) {
        set(i,0);
      }
    }